

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

string_view __thiscall bloaty::RangeSink::TranslateVMToFile(RangeSink *this,uint64_t address)

{
  string_view format;
  bool bVar1;
  Arg *pAVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view sVar4;
  uint64_t translated;
  char *in_stack_ffffffffffffff28;
  int line;
  Arg *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  undefined1 uVar5;
  Arg *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  undefined1 local_58 [32];
  string_view local_38;
  Arg *local_28;
  
  if (in_RDI[0xf]._M_len == 0) {
    __assert_fail("translator_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                  0x55b,"std::string_view bloaty::RangeSink::TranslateVMToFile(uint64_t)");
  }
  bVar1 = RangeMap::Translate((RangeMap *)in_stack_ffffffffffffff48,(uint64_t)in_RDI,
                              (uint64_t *)
                              CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  uVar5 = true;
  if (bVar1) {
    local_38 = InputFile::data((InputFile *)in_RDI->_M_len);
    pAVar2 = (Arg *)std::basic_string_view<char,_std::char_traits<char>_>::size(&local_38);
    uVar5 = pAVar2 < local_28;
    in_stack_ffffffffffffff30 = local_28;
  }
  if ((bool)uVar5 != false) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&in_stack_ffffffffffffff30->piece_,in_stack_ffffffffffffff28);
    absl::substitute_internal::Arg::Arg
              (in_stack_ffffffffffffff30,(unsigned_long)in_stack_ffffffffffffff28);
    line = (int)((ulong)local_58 >> 0x20);
    format._M_str = in_stack_ffffffffffffff58;
    format._M_len = in_stack_ffffffffffffff50;
    absl::Substitute_abi_cxx11_(format,in_stack_ffffffffffffff48);
    std::__cxx11::string::c_str();
    Throw((char *)in_stack_ffffffffffffff30,line);
  }
  InputFile::data((InputFile *)in_RDI->_M_len);
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (in_RDI,CONCAT17(uVar5,in_stack_ffffffffffffff38),
                     (size_type)in_stack_ffffffffffffff30);
  sVar4._M_len = bVar3._M_len;
  sVar4._M_str = bVar3._M_str;
  return sVar4;
}

Assistant:

std::string_view RangeSink::TranslateVMToFile(uint64_t address) {
  assert(translator_);
  uint64_t translated;
  if (!translator_->vm_map.Translate(address, &translated) ||
      translated > file_->data().size()) {
    THROWF("Can't translate VM pointer ($0) to file", address);

  }
  return file_->data().substr(translated);
}